

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>
__thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator
          (ValueArray<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>
           *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  element_type *in_RDI;
  ParamGenerator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>
  PVar1;
  vector<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::allocator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
  *in_stack_ffffffffffffffc0;
  vector<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::allocator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
  *in_stack_ffffffffffffffc8;
  ValueArray<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_> local_28
  ;
  
  ValueArray<libaom_test::FuncParam<void(*)(short*,short_const*,short_const*,int)>>::
  MakeVector<libaom_test::FuncParam<void(*)(short*,short_const*,short_const*,int)>,0ul>
            (&local_28,in_RSI);
  ValuesIn<std::vector<libaom_test::FuncParam<void(*)(short*,short_const*,short_const*,int)>,std::allocator<libaom_test::FuncParam<void(*)(short*,short_const*,short_const*,int)>>>>
            (in_stack_ffffffffffffffc8);
  std::
  vector<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::allocator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
  ::~vector(in_stack_ffffffffffffffc0);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ParamGenerator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }